

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O1

void __thiscall
irr::core::string<unsigned_long>::string<unsigned_long>
          (string<unsigned_long> *this,unsigned_long *c,s32 lenght)

{
  unsigned_long *puVar1;
  ulong uVar2;
  
  this->array = (unsigned_long *)0x0;
  this->allocated = 0;
  this->used = 0;
  if (c != (unsigned_long *)0x0) {
    this->used = lenght + 1;
    this->allocated = lenght + 1;
    uVar2 = 0xffffffffffffffff;
    if (-2 < lenght) {
      uVar2 = (long)lenght * 8 + 8;
    }
    puVar1 = (unsigned_long *)operator_new__(uVar2);
    this->array = puVar1;
    if (0 < lenght) {
      uVar2 = 0;
      do {
        this->array[uVar2] = c[uVar2];
        uVar2 = uVar2 + 1;
      } while ((uint)lenght != uVar2);
    }
    this->array[lenght] = 0;
  }
  return;
}

Assistant:

string(const B* c, s32 lenght)
	: array(0), allocated(0), used(0)
	{
		if (!c)
			return;

        allocated = used = lenght+1;
		array = new T[used];

		for (s32 l = 0; l<lenght; ++l)
			array[l] = (T)c[l];

		array[lenght] = 0;
	}